

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::newIndirect(QPDF *this,QPDFObjGen og,shared_ptr<QPDFObject> *obj)

{
  element_type *this_00;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  shared_ptr<QPDFObject> *obj_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  this_local = (QPDF *)obj;
  og_local = (QPDFObjGen)this;
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(in_RCX);
  QPDFObject::setDefaultDescription(this_00,(QPDF *)og,(QPDFObjGen *)&this_local);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(shared_ptr<QPDFObject> *)in_RCX);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::newIndirect(QPDFObjGen og, std::shared_ptr<QPDFObject> const& obj)
{
    obj->setDefaultDescription(this, og);
    return {obj};
}